

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

int pigpio_command(int pi,int command,int p1,int p2,int rl)

{
  ssize_t sVar1;
  int in_EDI;
  int in_R8D;
  cmdCmd_t cmd;
  undefined1 local_28 [12];
  int local_1c;
  int local_18;
  int local_8;
  int local_4;
  
  if (((in_EDI < 0) || (0x1f < in_EDI)) || (gPiInUse[in_EDI] == 0)) {
    local_4 = -0x7db;
  }
  else {
    local_1c = 0;
    local_18 = in_R8D;
    local_8 = in_EDI;
    _pml(0);
    sVar1 = send(gPigCommand[local_8],local_28,0x10,0);
    if (sVar1 == 0x10) {
      sVar1 = recv(gPigCommand[local_8],local_28,0x10,0x100);
      if (sVar1 == 0x10) {
        if (local_18 != 0) {
          _pmu(0);
        }
        local_4 = local_1c;
      }
      else {
        _pmu(0);
        local_4 = -0x7d1;
      }
    }
    else {
      _pmu(0);
      local_4 = -2000;
    }
  }
  return local_4;
}

Assistant:

static int pigpio_command(int pi, int command, int p1, int p2, int rl)
{
   cmdCmd_t cmd;

   if ((pi < 0) || (pi >= MAX_PI) || !gPiInUse[pi])
      return pigif_unconnected_pi;

   cmd.cmd = command;
   cmd.p1  = p1;
   cmd.p2  = p2;
   cmd.res = 0;

   _pml(pi);

   if (send(gPigCommand[pi], &cmd, sizeof(cmd), 0) != sizeof(cmd))
   {
      _pmu(pi);
      return pigif_bad_send;
   }

   if (recv(gPigCommand[pi], &cmd, sizeof(cmd), MSG_WAITALL) != sizeof(cmd))
   {
      _pmu(pi);
      return pigif_bad_recv;
   }

   if (rl) _pmu(pi);

   return cmd.res;
}